

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

int Intp_ManProofTraceOne(Intp_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  lit lVar1;
  Sto_Cls_t *pSVar2;
  int *piVar3;
  abctime aVar4;
  ulong uVar5;
  Vec_Int_t *p_00;
  long lVar6;
  lit *plVar7;
  abctime aVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint local_44;
  
  aVar4 = Abc_Clock();
  if (p->fProofVerif != 0) {
    uVar11 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar11) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x1e3,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar11 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  for (uVar5 = 0; uVar5 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff); uVar5 = uVar5 + 1) {
    p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar5 * 4) >> 1] = '\x01';
  }
  p_00 = Vec_IntAlloc(0x10);
  if (p->vAntClas->nSize != pFinal->Id - p->nAntStart) {
    __assert_fail("Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x1f5,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  Vec_IntPush(p_00,pConflict->Id);
  Vec_PtrPush(p->vAntClas,p_00);
  local_44 = p->pProofNums[pConflict->Id];
  uVar5 = (ulong)(uint)p->nTrailSize;
LAB_0071cd29:
  lVar6 = 9;
  uVar15 = uVar5 & 0xffffffff;
  do {
    uVar5 = uVar5 - 1;
    if ((int)uVar15 < 1) {
      if (p->fProofVerif == 0) goto LAB_0071d093;
      uVar11 = p->nResLits;
      uVar5 = 0;
      uVar15 = 0;
      if (0 < (int)uVar11) {
        uVar15 = (ulong)uVar11;
      }
      break;
    }
    uVar11 = p->pTrail[uVar5] >> 1;
    if (p->pSeens[(int)uVar11] != '\0') {
      p->pSeens[(int)uVar11] = '\0';
      pSVar2 = p->pReasons[(int)uVar11];
      if (pSVar2 != (Sto_Cls_t *)0x0) goto LAB_0071cd6e;
    }
    uVar15 = (ulong)((int)uVar15 - 1);
  } while( true );
LAB_0071cf92:
  if (uVar5 == uVar15) {
LAB_0071cff9:
    uVar12 = *(uint *)&pFinal->field_0x1c;
    if (uVar11 == (uVar12 >> 3 & 0xffffff)) {
LAB_0071d093:
      aVar8 = Abc_Clock();
      p->timeTrace = p->timeTrace + (aVar8 - aVar4);
      iVar9 = p->Counter;
      piVar3 = p->pProofNums;
      piVar3[pFinal->Id] = iVar9;
      if (piVar3[(long)pFinal->Id + -1] == iVar9) {
        __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x28b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
      return iVar9;
    }
    iVar9 = 0;
    do {
      uVar14 = uVar12 >> 3 & 0xffffff;
      uVar11 = p->nResLits;
      uVar5 = 0;
      if (0 < (int)uVar11) {
        uVar5 = (ulong)uVar11;
      }
LAB_0071d032:
      if ((int)uVar14 <= iVar9) {
        if (uVar11 != uVar14) {
          __assert_fail("p->nResLits == (int)pFinal->nLits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                        ,0x27f,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
        }
        goto LAB_0071d093;
      }
      lVar6 = (long)iVar9;
      uVar15 = 0;
      while (uVar5 != uVar15) {
        piVar3 = p->pResLits + uVar15;
        uVar15 = uVar15 + 1;
        if (*(int *)((long)&pFinal[1].pNext + lVar6 * 4) == *piVar3) goto code_r0x0071d057;
      }
      uVar12 = uVar12 & 0xf8000007 | uVar12 + 0x7fffff8 & 0x7fffff8;
      *(uint *)&pFinal->field_0x1c = uVar12;
      for (; lVar6 < (long)(ulong)(uVar12 >> 3 & 0xffffff); lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)&pFinal[1].pNext + lVar6 * 4) =
             *(undefined4 *)((long)&pFinal[1].pNext + lVar6 * 4 + 4);
        uVar12 = *(uint *)&pFinal->field_0x1c;
      }
    } while( true );
  }
  uVar10 = 0;
  do {
    if ((*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff) == uVar10) {
      printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
      Intp_ManPrintClause(p,pConflict);
      Intp_ManPrintResolvent(p->pResLits,p->nResLits);
      Intp_ManPrintClause(p,pFinal);
      uVar11 = p->nResLits;
      goto LAB_0071cff9;
    }
    lVar6 = uVar10 * 4;
    uVar10 = uVar10 + 1;
  } while (*(int *)((long)&pFinal[1].pNext + lVar6) != p->pResLits[uVar5]);
  uVar5 = uVar5 + 1;
  goto LAB_0071cf92;
code_r0x0071d057:
  iVar9 = iVar9 + 1;
  goto LAB_0071d032;
LAB_0071cd6e:
  if (p->pTrail[uVar5] != *(int *)&pSVar2[1].pNext) {
    __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x20b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  for (; lVar6 - 8U < (ulong)(*(uint *)&pSVar2->field_0x1c >> 3 & 0xffffff); lVar6 = lVar6 + 1) {
    p->pSeens[*(int *)((long)&pSVar2->pNext + lVar6 * 4) >> 1] = '\x01';
  }
  iVar9 = pSVar2->Id;
  if (p->pProofNums[iVar9] < 1) {
    __assert_fail("Intp_ManProofGet(p, pReason) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x213,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  uVar12 = p->Counter + 1;
  p->Counter = uVar12;
  if (p->fProofWrite != 0) {
    fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)uVar12,(ulong)local_44,
            (ulong)(uint)p->pProofNums[iVar9]);
    uVar12 = p->Counter;
  }
  local_44 = uVar12;
  if (p->fProofVerif != 0) {
    uVar12 = p->nResLits;
    uVar15 = 0;
    if (0 < (int)uVar12) {
      uVar15 = (ulong)uVar12;
    }
    for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
      if (p->pResLits[uVar10] >> 1 == uVar11) {
        uVar15 = uVar10 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar15 == uVar12) {
      printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
             (ulong)(uint)pFinal->Id,(ulong)uVar11);
    }
    plVar7 = p->pResLits;
    uVar12 = plVar7[uVar15];
    if ((*(uint *)&pSVar2[1].pNext ^ uVar12) != 1) {
      printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
             (ulong)(uint)pFinal->Id,(ulong)uVar11);
      plVar7 = p->pResLits;
      uVar12 = plVar7[uVar15];
    }
    if ((int)uVar12 >> 1 != uVar11) {
      __assert_fail("lit_var(p->pResLits[v1]) == Var",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x230,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    iVar9 = p->nResLits + -1;
    p->nResLits = iVar9;
    for (; (long)uVar15 < (long)iVar9; uVar15 = uVar15 + 1) {
      plVar7[uVar15] = plVar7[uVar15 + 1];
      iVar9 = p->nResLits;
    }
    for (uVar15 = 1; uVar15 < (*(uint *)&pSVar2->field_0x1c >> 3 & 0xffffff); uVar15 = uVar15 + 1) {
      uVar11 = p->nResLits;
      uVar10 = 0;
      if (0 < (int)uVar11) {
        uVar10 = (ulong)uVar11;
      }
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        if ((*(uint *)((long)&pSVar2[1].pNext + uVar15 * 4) ^ p->pResLits[uVar13]) < 2) {
          uVar10 = uVar13 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar10 == uVar11) {
        if (uVar11 == p->nResLitsAlloc) {
          printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                 (ulong)(uint)pFinal->Id);
          uVar11 = p->nResLits;
        }
        lVar1 = *(lit *)((long)&pSVar2[1].pNext + uVar15 * 4);
        p->nResLits = uVar11 + 1;
        p->pResLits[(int)uVar11] = lVar1;
      }
      else if (p->pResLits[uVar10] != *(int *)((long)&pSVar2[1].pNext + uVar15 * 4)) {
        printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
               ,(ulong)(uint)pFinal->Id);
      }
    }
  }
  lVar6 = (long)p->vAntClas->nSize;
  if (lVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  Vec_IntPush((Vec_Int_t *)p->vAntClas->pArray[lVar6 + -1],pSVar2->Id);
  goto LAB_0071cd29;
}

Assistant:

int Intp_ManProofTraceOne( Intp_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

//    assert( pFinal->Id == Vec_IntSize(p->vBreaks) );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
//    Vec_IntPush( p->vAnties, pConflict->Id );
    {
        Vec_Int_t * vAnts = Vec_IntAlloc( 16 );
        assert( Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart );
        Vec_IntPush( vAnts, pConflict->Id );
        Vec_PtrPush( p->vAntClas, vAnts );
    }

//    if ( p->pCnf->nClausesA )
//        Intp_ManAigCopy( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pConflict) );

    // follow the trail backwards
    PrevId = Intp_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Intp_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Intp_ManProofGet(p, pReason) );
        PrevId = p->Counter;

//        if ( p->pCnf->nClausesA )
//       {
//            if ( p->pVarTypes[Var] == 1 ) // var of A
//                Intp_ManAigOr( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//            else
//                Intp_ManAigAnd( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
//        Vec_IntPush( p->vAnties, pReason->Id );
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntryLast(p->vAntClas), pReason->Id );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Intp_ManPrintClause( p, pConflict );
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            Intp_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
//    if ( p->pCnf->nClausesA )
//    {
//        Intp_ManPrintInterOne( p, pFinal );
//    }
    Intp_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
//    if ( p->pProofNums[pFinal->Id] == p->pProofNums[pFinal->Id-1] )
//        p->pProofNums[pFinal->Id] = p->pProofNums[pConflict->Id];
    return p->Counter;
}